

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueScanner::ProcessOverBufferValue(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  CSVStates *this_01;
  shared_ptr<duckdb::CSVBufferHandle,_true> *psVar1;
  StringValueResult *result;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_02;
  idx_t *piVar2;
  pointer __src;
  byte bVar3;
  char cVar4;
  CSVState CVar5;
  char quote;
  size_type sVar6;
  idx_t iVar7;
  _Alloc_hider value_ptr;
  bool bVar8;
  CSVState CVar9;
  CSVBufferHandle *pCVar10;
  data_ptr_t pdVar11;
  CSVStateMachine *pCVar12;
  reference pvVar13;
  ulong uVar14;
  InternalException *this_03;
  ulong uVar15;
  uint uVar16;
  size_type sVar17;
  idx_t iVar18;
  idx_t iVar19;
  char *pcVar20;
  allocator local_91;
  undefined1 local_90 [12];
  undefined4 uStack_84;
  string local_80;
  idx_t local_60;
  char *local_58;
  string over_buffer_string;
  
  iVar18 = (this->result).super_ScannerResult.last_position.buffer_pos;
  psVar1 = &this->previous_buffer_handle;
  pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  if (iVar18 != pCVar10->actual_size) {
    *(undefined2 *)(this->super_BaseScanner).states.states = 0xb0b;
  }
  over_buffer_string._M_dataplus._M_p = (pointer)&over_buffer_string.field_2;
  over_buffer_string._M_string_length = 0;
  over_buffer_string.field_2._M_local_buf[0] = '\0';
  pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  pdVar11 = BufferHandle::Ptr(&pCVar10->handle);
  result = &this->result;
  (this->result).super_ScannerResult.quoted = false;
  this_00 = &(this->super_BaseScanner).state_machine;
  this_01 = &(this->super_BaseScanner).states;
  iVar19 = 0;
  for (iVar18 = (this->result).super_ScannerResult.last_position.buffer_pos;
      pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1),
      iVar18 < pCVar10->actual_size; iVar18 = iVar18 + 1) {
    pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    bVar3 = pdVar11[iVar18];
    CVar9 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar9;
    (this->super_BaseScanner).states.states[1] =
         pCVar12->transition_array->state_machine[bVar3][CVar9];
    bVar8 = CSVStates::EmptyLine(this_01);
    if ((!bVar8) &&
       (CVar9 = (this->super_BaseScanner).states.states[1], 1 < (byte)(CVar9 - RECORD_SEPARATOR))) {
      if (CVar9 == DELIMITER) break;
      if ((this->result).super_ScannerResult.comment == false) {
        ::std::__cxx11::string::push_back((char)&over_buffer_string);
      }
      if (this_01->states[0] == UNQUOTED) {
        ScannerResult::SetUnquoted(&result->super_ScannerResult);
      }
      else if (this_01->states[0] == QUOTED) {
        if ((result->super_ScannerResult).quoted == false) {
          (this->result).super_ScannerResult.quoted_position = iVar19;
        }
        (this->result).super_ScannerResult.quoted = true;
        (this->result).super_ScannerResult.unquoted = true;
      }
      bVar8 = CSVStates::IsEscaped(this_01);
      if ((bVar8) &&
         ((((this->result).super_ScannerResult.state_machine)->dialect_options).
          state_machine_options.escape.value != '\0')) {
        (this->result).super_ScannerResult.escaped = true;
      }
      CVar9 = (this->super_BaseScanner).states.states[1];
      if (CVar9 == INVALID) {
        StringValueResult::InvalidState(result);
      }
      else if (CVar9 == COMMENT) {
        (this->result).super_ScannerResult.comment = true;
      }
      iVar19 = iVar19 + 1;
    }
  }
  if ((over_buffer_string._M_string_length == 0) &&
     (pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar12->dialect_options).state_machine_options.new_line.value == CARRY_ON)) {
    if ((this->super_BaseScanner).iterator.is_set == true) {
      this_02 = &(this->super_BaseScanner).cur_buffer_handle;
      iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      while (pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_02),
            iVar18 < pCVar10->actual_size) {
        iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos;
        cVar4 = (this->super_BaseScanner).buffer_handle_ptr[iVar18];
        if (cVar4 == '\n') {
          pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_02);
          if (iVar18 + 1 == pCVar10->actual_size) goto LAB_00ac1643;
        }
        else {
          if (cVar4 != '\r') break;
          uVar14 = (this->result).super_ScannerResult.last_position.buffer_pos;
          pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
          if (uVar14 <= pCVar10->actual_size) {
            pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
            StringValueResult::AddValue(result,pCVar10->actual_size);
            if ((this->result).super_ScannerResult.comment == true) {
              StringValueResult::UnsetComment
                        (result,(this->super_BaseScanner).iterator.pos.buffer_pos);
            }
            else {
              pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
              StringValueResult::AddRow(result,pCVar10->actual_size);
            }
            pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            while( true ) {
              iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos;
              pcVar20 = (this->super_BaseScanner).buffer_handle_ptr;
              uVar14 = iVar18 + 1;
              (this->super_BaseScanner).iterator.pos.buffer_pos = uVar14;
              bVar3 = pcVar20[iVar18];
              CVar9 = (this->super_BaseScanner).states.states[1];
              (this->super_BaseScanner).states.states[0] = CVar9;
              (this->super_BaseScanner).states.states[1] =
                   pCVar12->transition_array->state_machine[bVar3][CVar9];
              pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_02);
              local_80._4_8_ =
                   (pointer)CONCAT44((undefined4)local_80._M_string_length,
                                     local_80._M_dataplus._M_p._4_4_);
              if ((pCVar10->actual_size <= uVar14) ||
                 ((cVar4 = (this->super_BaseScanner).buffer_handle_ptr
                           [(this->super_BaseScanner).iterator.pos.buffer_pos], cVar4 != '\r' &&
                  (local_80._4_8_ =
                        (pointer)CONCAT44((undefined4)local_80._M_string_length,
                                          local_80._M_dataplus._M_p._4_4_), cVar4 != '\n')))) break;
              pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            }
            goto LAB_00ac1643;
          }
        }
        pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos;
        bVar3 = (this->super_BaseScanner).buffer_handle_ptr[iVar18];
        CVar9 = (this->super_BaseScanner).states.states[1];
        (this->super_BaseScanner).states.states[0] = CVar9;
        (this->super_BaseScanner).states.states[1] =
             pCVar12->transition_array->state_machine[bVar3][CVar9];
        iVar18 = iVar18 + 1;
        (this->super_BaseScanner).iterator.pos.buffer_pos = iVar18;
      }
    }
    else {
      iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      if ((this->super_BaseScanner).buffer_handle_ptr[iVar18] == '\n') {
        (this->super_BaseScanner).iterator.pos.buffer_pos = iVar18 + 1;
      }
    }
  }
  psVar1 = &(this->super_BaseScanner).cur_buffer_handle;
  iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  while (pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1),
        iVar18 < pCVar10->actual_size) {
    pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    bVar3 = (this->super_BaseScanner).buffer_handle_ptr
            [(this->super_BaseScanner).iterator.pos.buffer_pos];
    CVar9 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar9;
    (this->super_BaseScanner).states.states[1] =
         pCVar12->transition_array->state_machine[bVar3][CVar9];
    bVar8 = CSVStates::EmptyLine(this_01);
    if (bVar8) {
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar12->dialect_options).num_cols == 1) break;
    }
    else {
      CVar9 = (this->super_BaseScanner).states.states[0];
      CVar5 = (this->super_BaseScanner).states.states[1];
      if (((byte)(CVar9 - QUOTED) < 0xfe && (byte)(CVar5 - RECORD_SEPARATOR) < 2) ||
         (CVar5 == DELIMITER)) break;
      if (CVar5 != COMMENT && (this->result).super_ScannerResult.comment == false) {
        ::std::__cxx11::string::push_back((char)&over_buffer_string);
        CVar9 = this_01->states[0];
      }
      if (CVar9 == QUOTED) {
        if ((result->super_ScannerResult).quoted == false) {
          (this->result).super_ScannerResult.quoted_position = iVar19;
        }
        (this->result).super_ScannerResult.quoted = true;
        (this->result).super_ScannerResult.unquoted = true;
      }
      if ((this->super_BaseScanner).states.states[1] == COMMENT) {
        (this->result).super_ScannerResult.comment = true;
      }
      bVar8 = CSVStates::IsEscaped(this_01);
      if ((bVar8) &&
         ((((this->result).super_ScannerResult.state_machine)->dialect_options).
          state_machine_options.escape.value != '\0')) {
        (this->result).super_ScannerResult.escaped = true;
      }
      if ((this->super_BaseScanner).states.states[1] == INVALID) {
        StringValueResult::InvalidState(result);
      }
      iVar19 = iVar19 + 1;
    }
    iVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos + 1;
    (this->super_BaseScanner).iterator.pos.buffer_pos = iVar18;
  }
  sVar6 = over_buffer_string._M_string_length;
  value_ptr._M_p = over_buffer_string._M_dataplus._M_p;
  if ((((this->result).projecting_columns == true) &&
      (uVar14 = (this->result).cur_col_id,
      (this->result).projected_columns.super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar14] == false)) &&
     (uVar14 != (this->result).number_of_columns)) {
    (this->result).cur_col_id = uVar14 + 1;
    bVar8 = CSVStates::EmptyLine(this_01);
    if (bVar8) {
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar12->dialect_options).num_cols == 1) {
        StringValueResult::EmptyLine(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
      }
    }
  }
  else {
    if (((result->super_ScannerResult).quoted == true) &&
       ((this->result).super_ScannerResult.comment == false)) {
      uVar14 = (this->result).super_ScannerResult.quoted_position;
      sVar17 = ~uVar14 + over_buffer_string._M_string_length;
      __src = over_buffer_string._M_dataplus._M_p + uVar14;
      uVar15 = over_buffer_string._M_string_length;
      do {
        uVar15 = uVar15 - 1;
        if (uVar15 == uVar14) goto LAB_00ac1438;
        if (((this->result).ignore_empty_values & 1U) == 0) goto LAB_00ac1413;
      } while (over_buffer_string._M_dataplus._M_p[uVar15] == ' ');
      sVar17 = uVar15 - uVar14;
LAB_00ac1413:
      uVar16 = (uint)sVar17;
      if (uVar16 < 0xd) {
        local_80._M_string_length._0_4_ = 0;
        local_80._M_dataplus._M_p._0_4_ = 0;
        local_80._M_dataplus._M_p._4_4_ = 0;
        if (uVar16 == 0) {
LAB_00ac1438:
          __src = (pointer)0x0;
          local_80._M_dataplus._M_p._0_4_ = 0;
          sVar17 = 0;
        }
        else {
          switchD_00916250::default(&local_80,__src,(ulong)(uVar16 & 0xf));
          __src = (pointer)CONCAT44((undefined4)local_80._M_string_length,
                                    local_80._M_dataplus._M_p._4_4_);
        }
      }
      else {
        local_80._M_dataplus._M_p._0_4_ = *(undefined4 *)__src;
      }
      local_80._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
      local_80._M_dataplus._M_p._4_4_ = SUB84(__src,0);
      local_90._8_4_ = local_80._M_dataplus._M_p._4_4_;
      local_90[4] = local_80._M_dataplus._M_p._0_1_;
      local_90[5] = local_80._M_dataplus._M_p._1_1_;
      local_90[6] = local_80._M_dataplus._M_p._2_1_;
      local_90[7] = local_80._M_dataplus._M_p._3_1_;
      local_90._0_4_ = (int)sVar17;
      uStack_84 = (undefined4)local_80._M_string_length;
      local_80._4_8_ = __src;
      if ((this->result).super_ScannerResult.escaped == true) {
        bVar8 = StringValueResult::HandleTooManyColumnsError(result,value_ptr._M_p,sVar6);
        sVar6 = over_buffer_string._M_string_length;
        if (!bVar8) {
          pcVar20 = over_buffer_string._M_dataplus._M_p +
                    (this->result).super_ScannerResult.quoted_position;
          pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          local_58 = (char *)CONCAT71(local_58._1_7_,
                                      (pCVar12->dialect_options).state_machine_options.escape.value)
          ;
          pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          local_60 = CONCAT71(local_60._1_7_,
                              (pCVar12->dialect_options).state_machine_options.quote.value);
          bVar8 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                  state_machine_options.strict_mode.value;
          pvVar13 = vector<duckdb::Vector,_true>::get<true>
                              (&(this->result).parse_chunk.data,(this->result).chunk_col_id);
          _local_90 = (anon_struct_16_3_d7536bce_for_pointer)
                      RemoveEscape(pcVar20,sVar6 - 2,(char)local_58,(char)local_60,bVar8,pvVar13);
LAB_00ac14ee:
          sVar17 = local_90._0_8_;
        }
      }
    }
    else {
      uVar16 = (uint)over_buffer_string._M_string_length;
      if (uVar16 < 0xd) {
        local_80._M_string_length._0_4_ = 0;
        local_80._M_dataplus._M_p._0_4_ = 0;
        local_80._M_dataplus._M_p._4_4_ = 0;
        if (uVar16 != 0) {
          switchD_00916250::default
                    (&local_80,over_buffer_string._M_dataplus._M_p,(ulong)(uVar16 & 0xf));
        }
      }
      else {
        local_80._M_dataplus._M_p._0_4_ = *(undefined4 *)over_buffer_string._M_dataplus._M_p;
        local_80._M_dataplus._M_p._4_4_ = SUB84(over_buffer_string._M_dataplus._M_p,0);
        local_80._M_string_length._0_4_ =
             (undefined4)((ulong)over_buffer_string._M_dataplus._M_p >> 0x20);
      }
      local_90._8_4_ = local_80._M_dataplus._M_p._4_4_;
      local_90[4] = local_80._M_dataplus._M_p._0_1_;
      local_90[5] = local_80._M_dataplus._M_p._1_1_;
      local_90[6] = local_80._M_dataplus._M_p._2_1_;
      local_90[7] = local_80._M_dataplus._M_p._3_1_;
      local_90._0_4_ = uVar16;
      uStack_84 = (undefined4)local_80._M_string_length;
      sVar17 = sVar6;
      local_80._4_8_ =
           (pointer)CONCAT44((undefined4)local_80._M_string_length,local_80._M_dataplus._M_p._4_4_);
      if ((this->result).super_ScannerResult.escaped == true) {
        bVar8 = StringValueResult::HandleTooManyColumnsError(result,value_ptr._M_p,sVar6);
        local_80._4_8_ =
             (pointer)CONCAT44((undefined4)local_80._M_string_length,local_80._M_dataplus._M_p._4_4_
                              );
        if (!bVar8) {
          local_58 = over_buffer_string._M_dataplus._M_p;
          local_60 = over_buffer_string._M_string_length;
          pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          cVar4 = (pCVar12->dialect_options).state_machine_options.escape.value;
          pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          quote = (pCVar12->dialect_options).state_machine_options.quote.value;
          bVar8 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                  state_machine_options.strict_mode.value;
          pvVar13 = vector<duckdb::Vector,_true>::get<true>
                              (&(this->result).parse_chunk.data,(this->result).chunk_col_id);
          _local_90 = (anon_struct_16_3_d7536bce_for_pointer)
                      RemoveEscape(local_58,local_60,cVar4,quote,bVar8,pvVar13);
          goto LAB_00ac14ee;
        }
      }
    }
    bVar8 = CSVStates::EmptyLine(this_01);
    if (bVar8) {
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if ((pCVar12->dialect_options).num_cols == 1) {
        StringValueResult::EmptyLine(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
        goto LAB_00ac157d;
      }
    }
    CVar9 = (this->super_BaseScanner).states.states[1];
    if ((CVar9 != NOT_SET) &&
       (((this->result).super_ScannerResult.comment != true || ((uint)sVar17 != 0)))) {
      iVar18 = sVar17 & 0xffffffff;
      if ((CVar9 == DELIMITER) &&
         ((sVar6 = (((this->result).super_ScannerResult.state_machine)->dialect_options).
                   state_machine_options.delimiter.value._M_string_length, sVar6 != 0 &&
          (uVar14 = sVar6 - 1, bVar8 = iVar18 < uVar14, iVar18 = iVar18 - uVar14, bVar8)))) {
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_80,
                   "Value size is lower than the number of extra delimiter bytes in the ProcessOverBufferValue()"
                   ,&local_91);
        InternalException::InternalException(this_03,&local_80);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((uint)sVar17 < 0xd) {
        pcVar20 = local_90 + 4;
      }
      else {
        pcVar20 = stack0xffffffffffffff78;
      }
      StringValueResult::AddValueToVector(result,pcVar20,iVar18,true);
    }
  }
LAB_00ac157d:
  if (((byte)((this->super_BaseScanner).states.states[0] - QUOTED) < 0xfe) &&
     ((byte)((this->super_BaseScanner).states.states[1] - RECORD_SEPARATOR) < 2)) {
    if ((this->result).super_ScannerResult.comment == true) {
      StringValueResult::UnsetComment(result,(this->super_BaseScanner).iterator.pos.buffer_pos);
    }
    else {
      StringValueResult::AddRowInternal(result);
    }
    piVar2 = &(this->super_BaseScanner).lines_read;
    *piVar2 = *piVar2 + 1;
  }
  uVar14 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
  if (pCVar10->actual_size <= uVar14) {
    pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(psVar1);
    if (pCVar10->is_last_buffer == true) {
      (this->result).added_last_line = true;
    }
  }
  if ((this->super_BaseScanner).states.states[1] == CARRIAGE_RETURN) {
    pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    if ((pCVar12->dialect_options).state_machine_options.new_line.value == CARRY_ON) {
      iVar18 = (this->super_BaseScanner).iterator.pos.buffer_idx;
      iVar19 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      (this->super_BaseScanner).iterator.pos.buffer_pos = iVar19 + 1;
      iVar19 = iVar19 + 2;
      goto LAB_00ac1619;
    }
  }
  iVar18 = (this->super_BaseScanner).iterator.pos.buffer_idx;
  iVar19 = (this->super_BaseScanner).iterator.pos.buffer_pos + 1;
  (this->super_BaseScanner).iterator.pos.buffer_pos = iVar19;
LAB_00ac1619:
  iVar7 = (this->result).buffer_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar19;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar7;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar18;
  (this->result).super_ScannerResult.quoted = false;
  (this->result).super_ScannerResult.escaped = false;
LAB_00ac1643:
  ::std::__cxx11::string::~string((string *)&over_buffer_string);
  return;
}

Assistant:

void StringValueScanner::ProcessOverBufferValue() {
	// Process first string
	if (result.last_position.buffer_pos != previous_buffer_handle->actual_size) {
		states.Initialize();
	}

	string over_buffer_string;
	auto previous_buffer = previous_buffer_handle->Ptr();
	idx_t j = 0;
	result.quoted = false;
	for (idx_t i = result.last_position.buffer_pos; i < previous_buffer_handle->actual_size; i++) {
		state_machine->Transition(states, previous_buffer[i]);
		if (states.EmptyLine() || states.IsCurrentNewRow()) {
			continue;
		}
		if (states.NewRow() || states.NewValue()) {
			break;
		} else if (!result.comment) {
			over_buffer_string += previous_buffer[i];
		}
		if (states.IsQuoted()) {
			result.SetQuoted(result, j);
		}
		if (states.IsUnquoted()) {
			result.SetUnquoted(result);
		}
		if (states.IsEscaped() && result.state_machine.dialect_options.state_machine_options.escape != '\0') {
			result.escaped = true;
		}
		if (states.IsComment()) {
			result.comment = true;
		}
		if (states.IsInvalid()) {
			result.InvalidState(result);
		}
		j++;
	}
	if (over_buffer_string.empty() &&
	    state_machine->dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		if (!iterator.IsBoundarySet()) {
			if (buffer_handle_ptr[iterator.pos.buffer_pos] == '\n') {
				iterator.pos.buffer_pos++;
			}
		} else {
			while (iterator.pos.buffer_pos < cur_buffer_handle->actual_size &&
			       (buffer_handle_ptr[iterator.pos.buffer_pos] == '\n' ||
			        buffer_handle_ptr[iterator.pos.buffer_pos] == '\r')) {
				if (buffer_handle_ptr[iterator.pos.buffer_pos] == '\r') {
					if (result.last_position.buffer_pos <= previous_buffer_handle->actual_size) {
						// we add the value
						result.AddValue(result, previous_buffer_handle->actual_size);
						if (result.IsCommentSet(result)) {
							result.UnsetComment(result, iterator.pos.buffer_pos);
						} else {
							result.AddRow(result, previous_buffer_handle->actual_size);
						}
						state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos++]);
						while (iterator.pos.buffer_pos < cur_buffer_handle->actual_size &&
						       (buffer_handle_ptr[iterator.pos.buffer_pos] == '\r' ||
						        buffer_handle_ptr[iterator.pos.buffer_pos] == '\n')) {
							state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos++]);
						}
						return;
					}
				} else {
					if (iterator.pos.buffer_pos + 1 == cur_buffer_handle->actual_size) {
						return;
					}
				}
				state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
				iterator.pos.buffer_pos++;
			}
		}
	}
	// second buffer
	for (; iterator.pos.buffer_pos < cur_buffer_handle->actual_size; iterator.pos.buffer_pos++) {
		state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
		if (states.EmptyLine()) {
			if (state_machine->dialect_options.num_cols == 1) {
				break;
			}
			continue;
		}
		if (states.NewRow() || states.NewValue()) {
			break;
		} else if (!result.comment && !states.IsComment()) {
			over_buffer_string += buffer_handle_ptr[iterator.pos.buffer_pos];
		}
		if (states.IsQuoted()) {
			result.SetQuoted(result, j);
		}
		if (states.IsComment()) {
			result.comment = true;
		}
		if (states.IsEscaped() && result.state_machine.dialect_options.state_machine_options.escape != '\0') {
			result.escaped = true;
		}
		if (states.IsInvalid()) {
			result.InvalidState(result);
		}
		j++;
	}
	bool skip_value = false;
	if (result.projecting_columns) {
		if (!result.projected_columns[result.cur_col_id] && result.cur_col_id != result.number_of_columns) {
			result.cur_col_id++;
			skip_value = true;
		}
	}
	if (!skip_value) {
		string_t value;
		if (result.quoted && !result.comment) {
			idx_t length = over_buffer_string.size() - 1 - result.quoted_position;
			while (length > 0 && result.ignore_empty_values &&
			       over_buffer_string.c_str()[result.quoted_position + length] == ' ') {
				length--;
			}
			value = string_t(over_buffer_string.c_str() + result.quoted_position, UnsafeNumericCast<uint32_t>(length));
			if (result.escaped) {
				if (!result.HandleTooManyColumnsError(over_buffer_string.c_str(), over_buffer_string.size())) {
					const auto str_ptr = over_buffer_string.c_str() + result.quoted_position;
					value =
					    RemoveEscape(str_ptr, over_buffer_string.size() - 2,
					                 state_machine->dialect_options.state_machine_options.escape.GetValue(),
					                 state_machine->dialect_options.state_machine_options.quote.GetValue(),
					                 result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
					                 result.parse_chunk.data[result.chunk_col_id]);
				}
			}
		} else {
			value = string_t(over_buffer_string.c_str(), UnsafeNumericCast<uint32_t>(over_buffer_string.size()));
			if (result.escaped) {
				if (!result.HandleTooManyColumnsError(over_buffer_string.c_str(), over_buffer_string.size())) {
					value =
					    RemoveEscape(over_buffer_string.c_str(), over_buffer_string.size(),
					                 state_machine->dialect_options.state_machine_options.escape.GetValue(),
					                 state_machine->dialect_options.state_machine_options.quote.GetValue(),
					                 result.state_machine.dialect_options.state_machine_options.strict_mode.GetValue(),
					                 result.parse_chunk.data[result.chunk_col_id]);
				}
			}
		}
		if (states.EmptyLine() && state_machine->dialect_options.num_cols == 1) {
			result.EmptyLine(result, iterator.pos.buffer_pos);
		} else if (!states.IsNotSet() && (!result.comment || !value.Empty())) {
			idx_t value_size = value.GetSize();
			if (states.IsDelimiter() &&
			    !result.state_machine.dialect_options.state_machine_options.delimiter.GetValue().empty()) {
				idx_t extra_delimiter_bytes =
				    result.state_machine.dialect_options.state_machine_options.delimiter.GetValue().size() - 1;
				if (extra_delimiter_bytes > value_size) {
					throw InternalException(
					    "Value size is lower than the number of extra delimiter bytes in the ProcessOverBufferValue()");
				}
				value_size -= extra_delimiter_bytes;
			}
			result.AddValueToVector(value.GetData(), value_size, true);
		}
	} else {
		if (states.EmptyLine() && state_machine->dialect_options.num_cols == 1) {
			result.EmptyLine(result, iterator.pos.buffer_pos);
		}
	}

	if (states.NewRow() && !states.IsNotSet()) {
		if (result.IsCommentSet(result)) {
			result.UnsetComment(result, iterator.pos.buffer_pos);
		} else {
			result.AddRowInternal();
		}
		lines_read++;
	}

	if (iterator.pos.buffer_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer) {
		result.added_last_line = true;
	}
	if (states.IsCarriageReturn() &&
	    state_machine->dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
		result.last_position = {iterator.pos.buffer_idx, ++iterator.pos.buffer_pos + 1, result.buffer_size};
	} else {
		result.last_position = {iterator.pos.buffer_idx, ++iterator.pos.buffer_pos, result.buffer_size};
	}
	// Be sure to reset the quoted and escaped variables
	result.quoted = false;
	result.escaped = false;
}